

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  uint64_t uVar5;
  uv__io_s *puVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  uint64_t uVar11;
  ulong uVar12;
  uint uVar13;
  uv__io_t *__events;
  sigset_t *__set;
  bool bVar14;
  int local_30f0;
  int local_30e8;
  epoll_event e;
  sigset_t sigset;
  epoll_event events [1024];
  
  if (loop->nfds == 0) {
    if (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      __assert_fail("QUEUE_EMPTY(&loop->watcher_queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0xda,"void uv__io_poll(uv_loop_t *, int)");
    }
  }
  else {
    e.data.u64._4_4_ = 0;
    e._0_8_ = 0;
    while (plVar3 = (long *)loop->watcher_queue[0], loop->watcher_queue != (void **)plVar3) {
      lVar4 = *plVar3;
      *(long *)plVar3[1] = lVar4;
      *(long *)(lVar4 + 8) = plVar3[1];
      *plVar3 = (long)plVar3;
      plVar3[1] = (long)plVar3;
      if (*(uint32_t *)(plVar3 + 2) == 0) {
        __assert_fail("w->pevents != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xe6,"void uv__io_poll(uv_loop_t *, int)");
      }
      iVar8 = (int)plVar3[3];
      if (iVar8 < 0) {
        __assert_fail("w->fd >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xe7,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)loop->nwatchers <= iVar8) {
        __assert_fail("w->fd < (int) loop->nwatchers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0xe8,"void uv__io_poll(uv_loop_t *, int)");
      }
      e.data.fd = iVar8;
      e.events = *(uint32_t *)(plVar3 + 2);
      iVar1 = *(int *)((long)plVar3 + 0x14);
      iVar8 = epoll_ctl(loop->backend_fd,(uint)(iVar1 != 0) * 2 + 1,iVar8,(epoll_event *)&e);
      if (iVar8 != 0) {
        piVar10 = __errno_location();
        if (*piVar10 != 0x11) goto LAB_003e651a;
        if (iVar1 != 0) {
          __assert_fail("op == EPOLL_CTL_ADD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0xf9,"void uv__io_poll(uv_loop_t *, int)");
        }
        iVar8 = epoll_ctl(loop->backend_fd,3,(int)plVar3[3],(epoll_event *)&e);
        if (iVar8 != 0) goto LAB_003e651a;
      }
      *(int *)((long)plVar3 + 0x14) = (int)plVar3[2];
    }
    if ((loop->flags & 1) == 0) {
      __set = (__sigset_t *)0x0;
    }
    else {
      __set = (sigset_t *)&sigset;
      sigemptyset(__set);
      sigaddset(__set,0x1b);
    }
    if (timeout < -1) {
      __assert_fail("timeout >= -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x10a,"void uv__io_poll(uv_loop_t *, int)");
    }
    uVar5 = loop->time;
    local_30e8 = 0x30;
    local_30f0 = timeout;
LAB_003e62a7:
    do {
      while( true ) {
        __events = (uv__io_t *)events;
        uVar9 = epoll_pwait(loop->backend_fd,(epoll_event *)__events,0x400,timeout,__set);
        piVar10 = __errno_location();
        iVar8 = *piVar10;
        uVar11 = uv__hrtime(UV_CLOCK_FAST);
        uVar12 = uVar11 / 1000000;
        loop->time = uVar12;
        *piVar10 = iVar8;
        if (uVar9 != 0xffffffff) break;
        if (iVar8 != 4) {
LAB_003e651a:
          abort();
        }
        if (timeout != -1) {
          if (timeout == 0) {
            return;
          }
LAB_003e6464:
          local_30f0 = local_30f0 + ((int)uVar5 - (int)uVar12);
          timeout = local_30f0;
          if (local_30f0 < 1) {
            return;
          }
        }
      }
      if (uVar9 == 0) {
        if (timeout == 0) {
          return;
        }
        if (timeout == -1) {
          __assert_fail("timeout != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x123,"void uv__io_poll(uv_loop_t *, int)");
        }
        goto LAB_003e6464;
      }
      if (loop->watchers == (uv__io_t **)0x0) {
        __assert_fail("loop->watchers != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x13f,"void uv__io_poll(uv_loop_t *, int)");
      }
      uVar2 = loop->nwatchers;
      loop->watchers[uVar2] = __events;
      loop->watchers[uVar2 + 1] = (uv__io_t *)(long)(int)uVar9;
      bVar7 = false;
      uVar12 = 0;
      if (0 < (int)uVar9) {
        uVar12 = (ulong)uVar9;
      }
      iVar8 = 0;
      while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
        uVar2 = *(uint *)((long)&__events->cb + 4);
        if ((ulong)uVar2 != 0xffffffff) {
          if ((int)uVar2 < 0) {
            __assert_fail("fd >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x14a,"void uv__io_poll(uv_loop_t *, int)");
          }
          if (loop->nwatchers <= uVar2) {
            __assert_fail("(unsigned) fd < loop->nwatchers",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x14b,"void uv__io_poll(uv_loop_t *, int)");
          }
          puVar6 = loop->watchers[uVar2];
          if (puVar6 == (uv__io_s *)0x0) {
            epoll_ctl(loop->backend_fd,2,uVar2,(epoll_event *)__events);
          }
          else {
            uVar2 = puVar6->pevents;
            uVar13 = (uVar2 | 0x18) & *(uint *)&__events->cb;
            *(uint *)&__events->cb = uVar13;
            if (uVar13 != 0) {
              if ((uVar13 == 0x10) || (uVar13 == 8)) {
                uVar13 = uVar13 | uVar2 & 0x2007;
                *(uint *)&__events->cb = uVar13;
              }
              bVar14 = true;
              if (puVar6 != &loop->signal_io_watcher) {
                (*puVar6->cb)(loop,puVar6,uVar13);
                bVar14 = bVar7;
              }
              iVar8 = iVar8 + 1;
              bVar7 = bVar14;
            }
          }
        }
        __events = (uv__io_t *)((long)__events->pending_queue + 4);
      }
      if (bVar7) {
        (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
        uVar9 = loop->nwatchers;
        loop->watchers[uVar9] = (uv__io_t *)0x0;
        loop->watchers[uVar9 + 1] = (uv__io_t *)0x0;
        return;
      }
      uVar2 = loop->nwatchers;
      loop->watchers[uVar2] = (uv__io_t *)0x0;
      loop->watchers[uVar2 + 1] = (uv__io_t *)0x0;
      if (iVar8 == 0) {
        if (timeout != -1) {
          if (timeout == 0) {
            return;
          }
          if (timeout < 1) {
            __assert_fail("timeout > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x199,"void uv__io_poll(uv_loop_t *, int)");
          }
          uVar12 = loop->time;
          goto LAB_003e6464;
        }
        goto LAB_003e62a7;
      }
      if (uVar9 != 0x400) {
        return;
      }
      timeout = 0;
      local_30e8 = local_30e8 + -1;
    } while (local_30e8 != 0);
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  /* A bug in kernels < 2.6.37 makes timeouts larger than ~30 minutes
   * effectively infinite on 32 bits architectures.  To avoid blocking
   * indefinitely, we cap the timeout and poll again if necessary.
   *
   * Note that "30 minutes" is a simplification because it depends on
   * the value of CONFIG_HZ.  The magic constant assumes CONFIG_HZ=1200,
   * that being the largest value I have seen in the wild (and only once.)
   */
  static const int max_safe_timeout = 1789569;
  struct epoll_event events[1024];
  struct epoll_event* pe;
  struct epoll_event e;
  int real_timeout;
  QUEUE* q;
  uv__io_t* w;
  sigset_t sigset;
  sigset_t* psigset;
  uint64_t base;
  int have_signals;
  int nevents;
  int count;
  int nfds;
  int fd;
  int op;
  int i;

  if (loop->nfds == 0) {
    assert(QUEUE_EMPTY(&loop->watcher_queue));
    return;
  }

  memset(&e, 0, sizeof(e));

  while (!QUEUE_EMPTY(&loop->watcher_queue)) {
    q = QUEUE_HEAD(&loop->watcher_queue);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);

    w = QUEUE_DATA(q, uv__io_t, watcher_queue);
    assert(w->pevents != 0);
    assert(w->fd >= 0);
    assert(w->fd < (int) loop->nwatchers);

    e.events = w->pevents;
    e.data.fd = w->fd;

    if (w->events == 0)
      op = EPOLL_CTL_ADD;
    else
      op = EPOLL_CTL_MOD;

    /* XXX Future optimization: do EPOLL_CTL_MOD lazily if we stop watching
     * events, skip the syscall and squelch the events after epoll_wait().
     */
    if (epoll_ctl(loop->backend_fd, op, w->fd, &e)) {
      if (errno != EEXIST)
        abort();

      assert(op == EPOLL_CTL_ADD);

      /* We've reactivated a file descriptor that's been watched before. */
      if (epoll_ctl(loop->backend_fd, EPOLL_CTL_MOD, w->fd, &e))
        abort();
    }

    w->events = w->pevents;
  }

  psigset = NULL;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    psigset = &sigset;
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  for (;;) {
    /* See the comment for max_safe_timeout for an explanation of why
     * this is necessary.  Executive summary: kernel bug workaround.
     */
    if (sizeof(int32_t) == sizeof(long) && timeout >= max_safe_timeout)
      timeout = max_safe_timeout;

    nfds = epoll_pwait(loop->backend_fd,
                       events,
                       ARRAY_SIZE(events),
                       timeout,
                       psigset);

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (timeout == 0)
        return;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno != EINTR)
        abort();

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_signals = 0;
    nevents = 0;

    assert(loop->watchers != NULL);
    loop->watchers[loop->nwatchers] = (void*) events;
    loop->watchers[loop->nwatchers + 1] = (void*) (uintptr_t) nfds;
    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher)
          have_signals = 1;
        else
          w->cb(loop, w, pe->events);

        nevents++;
      }
    }

    if (have_signals != 0)
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);

    loop->watchers[loop->nwatchers] = NULL;
    loop->watchers[loop->nwatchers + 1] = NULL;

    if (have_signals != 0)
      return;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      return;
    }

    if (timeout == 0)
      return;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      return;

    timeout = real_timeout;
  }
}